

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

int __thiscall absl::Cord::CompareImpl(Cord *this,Cord *rhs)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t size_to_compare;
  
  uVar3 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
  if ((uVar3 & 1) == 0) {
    size_to_compare = uVar3 >> 1;
  }
  else {
    size_to_compare = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  uVar3 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
  if ((uVar3 & 1) == 0) {
    uVar3 = uVar3 >> 1;
  }
  else {
    uVar3 = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (size_to_compare == uVar3) {
    iVar1 = GenericCompare<int,absl::Cord>(this,rhs,size_to_compare);
    return iVar1;
  }
  if (size_to_compare < uVar3) {
    uVar2 = GenericCompare<int,absl::Cord>(this,rhs,size_to_compare);
    uVar2 = uVar2 | -(uint)(uVar2 == 0);
  }
  else {
    iVar1 = GenericCompare<int,absl::Cord>(this,rhs,uVar3);
    uVar2 = iVar1 + (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

int Cord::CompareImpl(const Cord& rhs) const {
  return SharedCompareImpl(*this, rhs);
}